

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_strtoi(char *str,char **endptr)

{
  bool bVar1;
  int value;
  char *p;
  int neg;
  char **endptr_local;
  char *str_local;
  int local_4;
  
  neg = 1;
  value = 0;
  p = str;
  if (str == (char *)0x0) {
    local_4 = 0;
  }
  else {
    for (; *p == ' '; p = p + 1) {
    }
    if (*p == '-') {
      neg = -1;
      p = p + 1;
    }
    while( true ) {
      bVar1 = false;
      if ((*p != '\0') && (bVar1 = false, '/' < *p)) {
        bVar1 = *p < ':';
      }
      if (!bVar1) break;
      value = value * 10 + *p + -0x30;
      p = p + 1;
    }
    if (endptr != (char **)0x0) {
      *endptr = p;
    }
    local_4 = neg * value;
  }
  return local_4;
}

Assistant:

NK_API int
nk_strtoi(const char *str, const char **endptr)
{
int neg = 1;
const char *p = str;
int value = 0;

NK_ASSERT(str);
if (!str) return 0;

/* skip whitespace */
while (*p == ' ') p++;
if (*p == '-') {
neg = -1;
p++;
}
while (*p && *p >= '0' && *p <= '9') {
value = value * 10 + (int) (*p - '0');
p++;
}
if (endptr)
*endptr = p;
return neg*value;
}